

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::AdamTrainer::update(AdamTrainer *this,real scale)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  Model *pMVar7;
  undefined8 *puVar8;
  Parameters *this_00;
  pointer pSVar9;
  pointer pSVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  LookupParameters *this_01;
  pointer pSVar15;
  pointer pSVar16;
  long lVar17;
  long lVar18;
  pointer pTVar19;
  pointer pTVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  Index size_2;
  int iVar29;
  uint uVar30;
  Index index_3;
  undefined8 *puVar31;
  char *__function;
  Index index_5;
  uint uVar32;
  Index size_4;
  Index size_3;
  Index index_1;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  Index size_1;
  _Hash_node_base *p_Var44;
  int iVar45;
  int iVar46;
  uint uVar47;
  Index size;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar67;
  float fVar68;
  undefined1 auVar66 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar75;
  float fVar76;
  undefined1 in_XMM13 [16];
  undefined1 auVar73 [16];
  float fVar77;
  undefined1 auVar74 [16];
  ulong local_108;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_68;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_48;
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68,
               (this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_48);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68);
    AllocateShadowLookupParameters(&local_68,(this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_48);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_68);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68,
               (this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_48);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68);
    AllocateShadowLookupParameters(&local_68,(this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_48);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_68);
    this->shadow_params_allocated = true;
  }
  fVar48 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar7 = (this->super_Trainer).model;
  puVar31 = *(undefined8 **)(pMVar7 + 0x18);
  puVar8 = *(undefined8 **)(pMVar7 + 0x20);
  if (puVar31 != puVar8) {
    fVar56 = fVar48 * scale;
    uVar35 = 0;
    do {
      this_00 = (Parameters *)*puVar31;
      uVar28 = update::t + 1;
      uVar36 = (ulong)(this_00->g).d.nd;
      iVar46 = 1;
      iVar29 = 1;
      if (uVar36 != 0) {
        uVar33 = 0;
        do {
          iVar29 = iVar29 * (this_00->g).d.d[uVar33];
          uVar33 = uVar33 + 1;
        } while (uVar36 != uVar33);
      }
      pSVar9 = (this->m).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar36 = (ulong)pSVar9[uVar35].h.d.nd;
      if (uVar36 != 0) {
        iVar46 = 1;
        uVar33 = 0;
        do {
          iVar46 = iVar46 * *(int *)((long)pSVar9[uVar35].h.d.d + uVar33 * 4);
          uVar33 = uVar33 + 1;
        } while (uVar36 != uVar33);
      }
      uVar47 = iVar46 * pSVar9[uVar35].h.d.bd;
      uVar33 = (ulong)uVar47;
      pSVar10 = (this->v).
                super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar36 = (ulong)pSVar10[uVar35].h.d.nd;
      iVar46 = 1;
      iVar42 = 1;
      if (uVar36 != 0) {
        iVar42 = 1;
        uVar41 = 0;
        do {
          iVar42 = iVar42 * *(int *)((long)pSVar10[uVar35].h.d.d + uVar41 * 4);
          uVar41 = uVar41 + 1;
        } while (uVar36 != uVar41);
      }
      uVar43 = iVar42 * pSVar10[uVar35].h.d.bd;
      uVar41 = (ulong)uVar43;
      uVar36 = (ulong)(this_00->values).d.nd;
      if (uVar36 != 0) {
        iVar46 = 1;
        uVar39 = 0;
        do {
          iVar46 = iVar46 * (this_00->values).d.d[uVar39];
          uVar39 = uVar39 + 1;
        } while (uVar36 != uVar39);
      }
      uVar30 = iVar29 * (this_00->g).d.bd;
      update::t = uVar28;
      if (uVar47 != uVar30) goto LAB_00224919;
      pfVar11 = pSVar9[uVar35].h.v;
      uVar36 = uVar33;
      if ((((ulong)pfVar11 & 3) == 0) &&
         (uVar36 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 3), uVar33 <= uVar36)) {
        uVar36 = uVar33;
      }
      pfVar12 = (this_00->g).v;
      pfVar13 = pSVar10[uVar35].h.v;
      uVar32 = iVar46 * (this_00->values).d.bd;
      pfVar14 = (this_00->values).v;
      fVar6 = (this->super_Trainer).lambda;
      fVar51 = this->beta_1;
      fVar49 = 1.0 - fVar51;
      uVar37 = uVar33 - uVar36;
      uVar39 = uVar37 + 3;
      if (-1 < (long)uVar37) {
        uVar39 = uVar37;
      }
      if (uVar36 != 0) {
        uVar40 = 0;
        do {
          pfVar11[uVar40] = pfVar12[uVar40] * fVar56 * fVar49 + pfVar11[uVar40] * fVar51;
          uVar40 = uVar40 + 1;
        } while (uVar36 != uVar40);
      }
      uVar39 = (uVar39 & 0xfffffffffffffffc) + uVar36;
      if (3 < (long)uVar37) {
        do {
          pfVar2 = pfVar11 + uVar36;
          pfVar1 = pfVar12 + uVar36;
          auVar66._0_4_ = *pfVar1 * fVar56 * fVar49 + *pfVar2 * fVar51;
          auVar66._4_4_ = pfVar1[1] * fVar56 * fVar49 + pfVar2[1] * fVar51;
          auVar66._8_4_ = pfVar1[2] * fVar56 * fVar49 + pfVar2[2] * fVar51;
          auVar66._12_4_ = pfVar1[3] * fVar56 * fVar49 + pfVar2[3] * fVar51;
          *(undefined1 (*) [16])(pfVar11 + uVar36) = auVar66;
          uVar36 = uVar36 + 4;
        } while ((long)uVar36 < (long)uVar39);
      }
      if ((long)uVar39 < (long)uVar33) {
        do {
          pfVar11[uVar39] = pfVar12[uVar39] * fVar56 * fVar49 + pfVar11[uVar39] * fVar51;
          uVar39 = uVar39 + 1;
        } while (uVar33 != uVar39);
      }
      if (uVar43 != uVar30) goto LAB_0022495e;
      uVar36 = uVar41;
      if ((((ulong)pfVar13 & 3) == 0) &&
         (uVar36 = (ulong)(-((uint)((ulong)pfVar13 >> 2) & 0x3fffffff) & 3), uVar41 <= uVar36)) {
        uVar36 = uVar41;
      }
      fVar51 = this->beta_2;
      fVar49 = 1.0 - fVar51;
      uVar39 = uVar41 - uVar36;
      uVar33 = uVar39 + 3;
      if (-1 < (long)uVar39) {
        uVar33 = uVar39;
      }
      if (uVar36 != 0) {
        uVar37 = 0;
        do {
          pfVar13[uVar37] =
               pfVar12[uVar37] * fVar56 * pfVar12[uVar37] * fVar56 * fVar49 +
               pfVar13[uVar37] * fVar51;
          uVar37 = uVar37 + 1;
        } while (uVar36 != uVar37);
      }
      uVar33 = (uVar33 & 0xfffffffffffffffc) + uVar36;
      if (3 < (long)uVar39) {
        do {
          pfVar1 = pfVar13 + uVar36;
          pfVar2 = pfVar12 + uVar36;
          auVar73._0_4_ = *pfVar2 * fVar56 * *pfVar2 * fVar56 * fVar49 + *pfVar1 * fVar51;
          auVar73._4_4_ = pfVar2[1] * fVar56 * pfVar2[1] * fVar56 * fVar49 + pfVar1[1] * fVar51;
          auVar73._8_4_ = pfVar2[2] * fVar56 * pfVar2[2] * fVar56 * fVar49 + pfVar1[2] * fVar51;
          auVar73._12_4_ = pfVar2[3] * fVar56 * pfVar2[3] * fVar56 * fVar49 + pfVar1[3] * fVar51;
          *(undefined1 (*) [16])(pfVar13 + uVar36) = auVar73;
          uVar36 = uVar36 + 4;
        } while ((long)uVar36 < (long)uVar33);
      }
      if ((long)uVar33 < (long)uVar41) {
        do {
          pfVar13[uVar33] =
               pfVar12[uVar33] * fVar56 * pfVar12[uVar33] * fVar56 * fVar49 +
               pfVar13[uVar33] * fVar51;
          uVar33 = uVar33 + 1;
        } while (uVar41 != uVar33);
      }
      dVar21 = pow((double)this->beta_1,(double)uVar28);
      dVar22 = pow((double)this->beta_2,(double)update::t);
      if (uVar47 - uVar43 != 0) goto LAB_00224930;
      if (uVar43 != uVar32) goto LAB_00224947;
      uVar36 = (ulong)(this_00->values).d.nd;
      iVar29 = 1;
      if (uVar36 != 0) {
        uVar33 = 0;
        do {
          iVar29 = iVar29 * (this_00->values).d.d[uVar33];
          uVar33 = uVar33 + 1;
        } while (uVar36 != uVar33);
      }
      uVar28 = iVar29 * (this_00->values).d.bd;
      uVar36 = (ulong)uVar28;
      if (uVar28 != uVar32) {
LAB_002248fa:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      pfVar12 = (this_00->values).v;
      uVar33 = uVar36;
      if ((((ulong)pfVar12 & 3) == 0) &&
         (uVar33 = (ulong)(-((uint)((ulong)pfVar12 >> 2) & 0x3fffffff) & 3), uVar36 <= uVar33)) {
        uVar33 = uVar36;
      }
      fVar50 = (float)(1.0 - dVar21);
      fVar49 = (float)(1.0 - dVar22);
      fVar52 = -(this->super_Trainer).eta;
      fVar51 = this->eps;
      uVar39 = uVar36 - uVar33;
      uVar41 = uVar39 + 3;
      if (-1 < (long)uVar39) {
        uVar41 = uVar39;
      }
      if (uVar33 != 0) {
        uVar37 = 0;
        do {
          pfVar12[uVar37] =
               (((pfVar11[uVar37] / fVar50) * fVar52) / (SQRT(pfVar13[uVar37] / fVar49) + fVar51) -
               pfVar14[uVar37] * fVar6) + pfVar12[uVar37];
          uVar37 = uVar37 + 1;
        } while (uVar33 != uVar37);
      }
      uVar41 = (uVar41 & 0xfffffffffffffffc) + uVar33;
      if (3 < (long)uVar39) {
        auVar53._4_4_ = fVar50;
        auVar53._0_4_ = fVar50;
        auVar53._8_4_ = fVar50;
        auVar53._12_4_ = fVar50;
        do {
          auVar23._4_4_ = fVar49;
          auVar23._0_4_ = fVar49;
          auVar23._8_4_ = fVar49;
          auVar23._12_4_ = fVar49;
          auVar66 = divps(*(undefined1 (*) [16])(pfVar13 + uVar33),auVar23);
          fVar65 = auVar66._0_4_;
          fVar67 = auVar66._4_4_;
          fVar68 = auVar66._8_4_;
          fVar69 = auVar66._12_4_;
          auVar57._0_4_ = -(uint)((int)fVar65 < 0);
          auVar57._4_4_ = -(uint)((int)fVar67 < 0);
          auVar57._8_4_ = -(uint)((int)fVar68 < 0);
          auVar57._12_4_ = -(uint)((int)fVar69 < 0);
          auVar73 = rsqrtps(in_XMM13,auVar66);
          fVar72 = auVar73._0_4_;
          fVar75 = auVar73._4_4_;
          fVar76 = auVar73._8_4_;
          fVar77 = auVar73._12_4_;
          auVar66 = auVar66 & _DAT_00228c70;
          iVar29 = auVar66._0_4_;
          iVar46 = auVar66._4_4_;
          iVar42 = auVar66._8_4_;
          iVar45 = auVar66._12_4_;
          auVar70._0_4_ = -(uint)(-0x7f800002 < (int)(iVar29 - 1U ^ 0x80000000));
          auVar70._4_4_ = -(uint)(-0x7f800002 < (int)(iVar46 - 1U ^ 0x80000000));
          auVar70._8_4_ = -(uint)(-0x7f800002 < (int)(iVar42 - 1U ^ 0x80000000));
          auVar70._12_4_ = -(uint)(-0x7f800002 < (int)(iVar45 - 1U ^ 0x80000000));
          auVar58._0_4_ = -(uint)(iVar29 == 0x7f800000);
          auVar58._4_4_ = -(uint)(iVar46 == 0x7f800000);
          auVar58._8_4_ = -(uint)(iVar42 == 0x7f800000);
          auVar58._12_4_ = -(uint)(iVar45 == 0x7f800000);
          in_XMM13._0_4_ = -(uint)(0x7f800000 < iVar29);
          in_XMM13._4_4_ = -(uint)(0x7f800000 < iVar46);
          in_XMM13._8_4_ = -(uint)(0x7f800000 < iVar42);
          in_XMM13._12_4_ = -(uint)(0x7f800000 < iVar45);
          in_XMM13 = in_XMM13 | auVar58;
          auVar59._0_4_ = -(uint)((int)(iVar29 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar59._4_4_ = -(uint)((int)(iVar46 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar59._8_4_ = -(uint)((int)(iVar42 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar59._12_4_ = -(uint)((int)(iVar45 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar66 = auVar59 | in_XMM13 | ~auVar70 & auVar57;
          auVar73 = divps(*(undefined1 (*) [16])(pfVar11 + uVar33),auVar53);
          auVar60._0_4_ = auVar73._0_4_ * fVar52;
          auVar60._4_4_ = auVar73._4_4_ * fVar52;
          auVar60._8_4_ = auVar73._8_4_ * fVar52;
          auVar60._12_4_ = auVar73._12_4_ * fVar52;
          auVar25._4_4_ =
               (float)((uint)((fVar75 * fVar75 * fVar67 * -0.5 + 1.5) * fVar75 * fVar67) &
                      auVar66._4_4_) + fVar51;
          auVar25._0_4_ =
               (float)((uint)((fVar72 * fVar72 * fVar65 * -0.5 + 1.5) * fVar72 * fVar65) &
                      auVar66._0_4_) + fVar51;
          auVar25._8_4_ =
               (float)((uint)((fVar76 * fVar76 * fVar68 * -0.5 + 1.5) * fVar76 * fVar68) &
                      auVar66._8_4_) + fVar51;
          auVar25._12_4_ =
               (float)((uint)((fVar77 * fVar77 * fVar69 * -0.5 + 1.5) * fVar77 * fVar69) &
                      auVar66._12_4_) + fVar51;
          auVar66 = divps(auVar60,auVar25);
          pfVar1 = pfVar14 + uVar33;
          fVar65 = pfVar1[1];
          fVar67 = pfVar1[2];
          fVar68 = pfVar1[3];
          pfVar2 = pfVar12 + uVar33;
          fVar69 = pfVar2[1];
          fVar72 = pfVar2[2];
          fVar75 = pfVar2[3];
          pfVar3 = pfVar12 + uVar33;
          *pfVar3 = (auVar66._0_4_ - *pfVar1 * fVar6) + *pfVar2;
          pfVar3[1] = (auVar66._4_4_ - fVar65 * fVar6) + fVar69;
          pfVar3[2] = (auVar66._8_4_ - fVar67 * fVar6) + fVar72;
          pfVar3[3] = (auVar66._12_4_ - fVar68 * fVar6) + fVar75;
          uVar33 = uVar33 + 4;
        } while ((long)uVar33 < (long)uVar41);
      }
      if ((long)uVar41 < (long)uVar36) {
        do {
          pfVar12[uVar41] =
               (((pfVar11[uVar41] / fVar50) * fVar52) / (SQRT(pfVar13[uVar41] / fVar49) + fVar51) -
               pfVar14[uVar41] * fVar6) + pfVar12[uVar41];
          uVar41 = uVar41 + 1;
        } while (uVar36 != uVar41);
      }
      Parameters::clear(this_00);
      uVar35 = (ulong)((int)uVar35 + 1);
      puVar31 = puVar31 + 1;
    } while (puVar31 != puVar8);
  }
  pMVar7 = (this->super_Trainer).model;
  puVar31 = *(undefined8 **)(pMVar7 + 0x30);
  puVar8 = *(undefined8 **)(pMVar7 + 0x38);
  if (puVar31 != puVar8) {
    fVar48 = fVar48 * scale;
    local_108 = 0;
    do {
      this_01 = (LookupParameters *)*puVar31;
      p_Var44 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var44 != (_Hash_node_base *)0x0) {
        pSVar15 = (this->lm).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar16 = (this->lv).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar35 = (ulong)*(uint *)&p_Var44[1]._M_nxt;
          lVar17 = *(long *)&pSVar15[local_108].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
          lVar4 = lVar17 + uVar35 * 0x48;
          iVar29 = 1;
          iVar46 = 1;
          if ((ulong)*(uint *)(lVar4 + 0x1c) != 0) {
            iVar46 = 1;
            uVar36 = 0;
            do {
              iVar46 = iVar46 * *(int *)(lVar4 + uVar36 * 4);
              uVar36 = uVar36 + 1;
            } while (*(uint *)(lVar4 + 0x1c) != uVar36);
          }
          lVar18 = *(long *)&pSVar16[local_108].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
          lVar5 = lVar18 + uVar35 * 0x48;
          if ((ulong)*(uint *)(lVar5 + 0x1c) != 0) {
            iVar29 = 1;
            uVar36 = 0;
            do {
              iVar29 = iVar29 * *(int *)(lVar5 + uVar36 * 4);
              uVar36 = uVar36 + 1;
            } while (*(uint *)(lVar5 + 0x1c) != uVar36);
          }
          pTVar19 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar19[uVar35].d.nd;
          iVar45 = 1;
          iVar42 = 1;
          if (uVar36 != 0) {
            uVar33 = 0;
            do {
              iVar42 = iVar42 * pTVar19[uVar35].d.d[uVar33];
              uVar33 = uVar33 + 1;
            } while (uVar36 != uVar33);
          }
          pTVar20 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar20[uVar35].d.nd;
          if (uVar36 != 0) {
            iVar45 = 1;
            uVar33 = 0;
            do {
              iVar45 = iVar45 * pTVar20[uVar35].d.d[uVar33];
              uVar33 = uVar33 + 1;
            } while (uVar36 != uVar33);
          }
          uVar47 = iVar46 * *(int *)(lVar4 + 0x20);
          uVar36 = (ulong)uVar47;
          uVar28 = iVar42 * pTVar19[uVar35].d.bd;
          if (uVar47 != uVar28) goto LAB_00224919;
          uVar33 = *(ulong *)(lVar17 + 0x28 + uVar35 * 0x48);
          uVar41 = uVar36;
          if (((uVar33 & 3) == 0) &&
             (uVar41 = (ulong)(-((uint)(uVar33 >> 2) & 0x3fffffff) & 3), uVar36 <= uVar41)) {
            uVar41 = uVar36;
          }
          uVar43 = iVar29 * *(int *)(lVar5 + 0x20);
          uVar40 = (ulong)uVar43;
          uVar39 = *(ulong *)(lVar18 + 0x28 + uVar35 * 0x48);
          pfVar11 = pTVar19[uVar35].v;
          uVar30 = iVar45 * pTVar20[uVar35].d.bd;
          pfVar12 = pTVar20[uVar35].v;
          fVar56 = (this->super_Trainer).lambda;
          fVar6 = this->beta_1;
          fVar51 = 1.0 - fVar6;
          uVar34 = uVar36 - uVar41;
          uVar37 = uVar34 + 3;
          if (-1 < (long)uVar34) {
            uVar37 = uVar34;
          }
          if (uVar41 != 0) {
            uVar38 = 0;
            do {
              *(float *)(uVar33 + uVar38 * 4) =
                   pfVar11[uVar38] * fVar48 * fVar51 + *(float *)(uVar33 + uVar38 * 4) * fVar6;
              uVar38 = uVar38 + 1;
            } while (uVar41 != uVar38);
          }
          uVar37 = (uVar37 & 0xfffffffffffffffc) + uVar41;
          if (3 < (long)uVar34) {
            do {
              pfVar13 = (float *)(uVar33 + uVar41 * 4);
              pfVar14 = pfVar11 + uVar41;
              auVar54._0_4_ = *pfVar14 * fVar48 * fVar51 + *pfVar13 * fVar6;
              auVar54._4_4_ = pfVar14[1] * fVar48 * fVar51 + pfVar13[1] * fVar6;
              auVar54._8_4_ = pfVar14[2] * fVar48 * fVar51 + pfVar13[2] * fVar6;
              auVar54._12_4_ = pfVar14[3] * fVar48 * fVar51 + pfVar13[3] * fVar6;
              *(undefined1 (*) [16])(uVar33 + uVar41 * 4) = auVar54;
              uVar41 = uVar41 + 4;
            } while ((long)uVar41 < (long)uVar37);
          }
          if ((long)uVar37 < (long)uVar36) {
            do {
              *(float *)(uVar33 + uVar37 * 4) =
                   pfVar11[uVar37] * fVar48 * fVar51 + *(float *)(uVar33 + uVar37 * 4) * fVar6;
              uVar37 = uVar37 + 1;
            } while (uVar36 != uVar37);
          }
          if (uVar43 != uVar28) goto LAB_0022495e;
          uVar36 = uVar40;
          if (((uVar39 & 3) == 0) &&
             (uVar36 = (ulong)(-((uint)(uVar39 >> 2) & 0x3fffffff) & 3), uVar40 <= uVar36)) {
            uVar36 = uVar40;
          }
          fVar6 = this->beta_2;
          fVar51 = 1.0 - fVar6;
          uVar37 = uVar40 - uVar36;
          uVar41 = uVar37 + 3;
          if (-1 < (long)uVar37) {
            uVar41 = uVar37;
          }
          if (uVar36 != 0) {
            uVar34 = 0;
            do {
              *(float *)(uVar39 + uVar34 * 4) =
                   pfVar11[uVar34] * fVar48 * pfVar11[uVar34] * fVar48 * fVar51 +
                   *(float *)(uVar39 + uVar34 * 4) * fVar6;
              uVar34 = uVar34 + 1;
            } while (uVar36 != uVar34);
          }
          uVar41 = (uVar41 & 0xfffffffffffffffc) + uVar36;
          if (3 < (long)uVar37) {
            do {
              pfVar14 = (float *)(uVar39 + uVar36 * 4);
              pfVar13 = pfVar11 + uVar36;
              auVar55._0_4_ = *pfVar13 * fVar48 * *pfVar13 * fVar48 * fVar51 + *pfVar14 * fVar6;
              auVar55._4_4_ =
                   pfVar13[1] * fVar48 * pfVar13[1] * fVar48 * fVar51 + pfVar14[1] * fVar6;
              auVar55._8_4_ =
                   pfVar13[2] * fVar48 * pfVar13[2] * fVar48 * fVar51 + pfVar14[2] * fVar6;
              auVar55._12_4_ =
                   pfVar13[3] * fVar48 * pfVar13[3] * fVar48 * fVar51 + pfVar14[3] * fVar6;
              *(undefined1 (*) [16])(uVar39 + uVar36 * 4) = auVar55;
              uVar36 = uVar36 + 4;
            } while ((long)uVar36 < (long)uVar41);
          }
          if ((long)uVar41 < (long)uVar40) {
            do {
              *(float *)(uVar39 + uVar41 * 4) =
                   pfVar11[uVar41] * fVar48 * pfVar11[uVar41] * fVar48 * fVar51 +
                   *(float *)(uVar39 + uVar41 * 4) * fVar6;
              uVar41 = uVar41 + 1;
            } while (uVar40 != uVar41);
          }
          dVar21 = pow((double)this->beta_1,(double)update::t);
          dVar22 = pow((double)this->beta_2,(double)update::t);
          if (uVar47 - uVar43 != 0) goto LAB_00224930;
          if (uVar43 != uVar30) goto LAB_00224947;
          pTVar19 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar19[uVar35].d.nd;
          iVar29 = 1;
          if (uVar36 != 0) {
            uVar41 = 0;
            do {
              iVar29 = iVar29 * pTVar19[uVar35].d.d[uVar41];
              uVar41 = uVar41 + 1;
            } while (uVar36 != uVar41);
          }
          uVar28 = iVar29 * pTVar19[uVar35].d.bd;
          uVar36 = (ulong)uVar28;
          if (uVar28 != uVar30) goto LAB_002248fa;
          pfVar11 = pTVar19[uVar35].v;
          uVar35 = uVar36;
          if ((((ulong)pfVar11 & 3) == 0) &&
             (uVar35 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 3), uVar36 <= uVar35))
          {
            uVar35 = uVar36;
          }
          fVar49 = (float)(1.0 - dVar21);
          fVar51 = (float)(1.0 - dVar22);
          fVar50 = -(this->super_Trainer).eta;
          fVar6 = this->eps;
          uVar37 = uVar36 - uVar35;
          uVar41 = uVar37 + 3;
          if (-1 < (long)uVar37) {
            uVar41 = uVar37;
          }
          if (uVar35 != 0) {
            uVar40 = 0;
            do {
              pfVar11[uVar40] =
                   (((*(float *)(uVar33 + uVar40 * 4) / fVar49) * fVar50) /
                    (SQRT(*(float *)(uVar39 + uVar40 * 4) / fVar51) + fVar6) -
                   pfVar12[uVar40] * fVar56) + pfVar11[uVar40];
              uVar40 = uVar40 + 1;
            } while (uVar35 != uVar40);
          }
          uVar41 = (uVar41 & 0xfffffffffffffffc) + uVar35;
          if (3 < (long)uVar37) {
            do {
              auVar24._4_4_ = fVar51;
              auVar24._0_4_ = fVar51;
              auVar24._8_4_ = fVar51;
              auVar24._12_4_ = fVar51;
              auVar66 = divps(*(undefined1 (*) [16])(uVar39 + uVar35 * 4),auVar24);
              fVar52 = auVar66._0_4_;
              fVar65 = auVar66._4_4_;
              fVar67 = auVar66._8_4_;
              fVar68 = auVar66._12_4_;
              auVar61._0_4_ = -(uint)((int)fVar52 < 0);
              auVar61._4_4_ = -(uint)((int)fVar65 < 0);
              auVar61._8_4_ = -(uint)((int)fVar67 < 0);
              auVar61._12_4_ = -(uint)((int)fVar68 < 0);
              auVar73 = rsqrtps(in_XMM13,auVar66);
              fVar69 = auVar73._0_4_;
              fVar72 = auVar73._4_4_;
              fVar75 = auVar73._8_4_;
              fVar76 = auVar73._12_4_;
              auVar66 = auVar66 & _DAT_00228c70;
              iVar29 = auVar66._0_4_;
              iVar46 = auVar66._4_4_;
              iVar42 = auVar66._8_4_;
              iVar45 = auVar66._12_4_;
              auVar71._0_4_ = -(uint)(-0x7f800002 < (int)(iVar29 - 1U ^ 0x80000000));
              auVar71._4_4_ = -(uint)(-0x7f800002 < (int)(iVar46 - 1U ^ 0x80000000));
              auVar71._8_4_ = -(uint)(-0x7f800002 < (int)(iVar42 - 1U ^ 0x80000000));
              auVar71._12_4_ = -(uint)(-0x7f800002 < (int)(iVar45 - 1U ^ 0x80000000));
              auVar62._0_4_ = -(uint)(iVar29 == (int)DAT_0022cfa0);
              auVar62._4_4_ = -(uint)(iVar46 == DAT_0022cfa0._4_4_);
              auVar62._8_4_ = -(uint)(iVar42 == DAT_0022cfa0._8_4_);
              auVar62._12_4_ = -(uint)(iVar45 == DAT_0022cfa0._12_4_);
              auVar74._0_4_ = -(uint)((int)DAT_0022cfa0 < iVar29);
              auVar74._4_4_ = -(uint)(DAT_0022cfa0._4_4_ < iVar46);
              auVar74._8_4_ = -(uint)(DAT_0022cfa0._8_4_ < iVar42);
              auVar74._12_4_ = -(uint)(DAT_0022cfa0._12_4_ < iVar45);
              in_XMM13 = auVar74 | auVar62;
              auVar63._0_4_ = -(uint)((int)(iVar29 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar63._4_4_ = -(uint)((int)(iVar46 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar63._8_4_ = -(uint)((int)(iVar42 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar63._12_4_ = -(uint)((int)(iVar45 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar66 = auVar63 | in_XMM13 | ~auVar71 & auVar61;
              auVar27._4_4_ = fVar49;
              auVar27._0_4_ = fVar49;
              auVar27._8_4_ = fVar49;
              auVar27._12_4_ = fVar49;
              auVar73 = divps(*(undefined1 (*) [16])(uVar33 + uVar35 * 4),auVar27);
              auVar64._0_4_ = auVar73._0_4_ * fVar50;
              auVar64._4_4_ = auVar73._4_4_ * fVar50;
              auVar64._8_4_ = auVar73._8_4_ * fVar50;
              auVar64._12_4_ = auVar73._12_4_ * fVar50;
              auVar26._4_4_ =
                   (float)((uint)((fVar72 * fVar72 * fVar65 * -0.5 + 1.5) * fVar72 * fVar65) &
                          auVar66._4_4_) + fVar6;
              auVar26._0_4_ =
                   (float)((uint)((fVar69 * fVar69 * fVar52 * -0.5 + 1.5) * fVar69 * fVar52) &
                          auVar66._0_4_) + fVar6;
              auVar26._8_4_ =
                   (float)((uint)((fVar75 * fVar75 * fVar67 * -0.5 + 1.5) * fVar75 * fVar67) &
                          auVar66._8_4_) + fVar6;
              auVar26._12_4_ =
                   (float)((uint)((fVar76 * fVar76 * fVar68 * -0.5 + 1.5) * fVar76 * fVar68) &
                          auVar66._12_4_) + fVar6;
              auVar66 = divps(auVar64,auVar26);
              pfVar13 = pfVar12 + uVar35;
              fVar52 = pfVar13[1];
              fVar65 = pfVar13[2];
              fVar67 = pfVar13[3];
              pfVar14 = pfVar11 + uVar35;
              fVar68 = pfVar14[1];
              fVar69 = pfVar14[2];
              fVar72 = pfVar14[3];
              pfVar1 = pfVar11 + uVar35;
              *pfVar1 = (auVar66._0_4_ - *pfVar13 * fVar56) + *pfVar14;
              pfVar1[1] = (auVar66._4_4_ - fVar52 * fVar56) + fVar68;
              pfVar1[2] = (auVar66._8_4_ - fVar65 * fVar56) + fVar69;
              pfVar1[3] = (auVar66._12_4_ - fVar67 * fVar56) + fVar72;
              uVar35 = uVar35 + 4;
            } while ((long)uVar35 < (long)uVar41);
          }
          if ((long)uVar41 < (long)uVar36) {
            do {
              pfVar11[uVar41] =
                   (((*(float *)(uVar33 + uVar41 * 4) / fVar49) * fVar50) /
                    (SQRT(*(float *)(uVar39 + uVar41 * 4) / fVar51) + fVar6) -
                   pfVar12[uVar41] * fVar56) + pfVar11[uVar41];
              uVar41 = uVar41 + 1;
            } while (uVar36 != uVar41);
          }
          p_Var44 = p_Var44->_M_nxt;
        } while (p_Var44 != (_Hash_node_base *)0x0);
      }
      LookupParameters::clear(this_01);
      local_108 = (ulong)((int)local_108 + 1);
      puVar31 = puVar31 + 1;
    } while (puVar31 != puVar8);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_00224919:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>]"
  ;
  goto LAB_00224973;
LAB_0022495e:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>]"
  ;
  goto LAB_00224973;
LAB_00224930:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Rhs = const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>]"
  ;
  goto LAB_00224973;
LAB_00224947:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, c..." /* TRUNCATED STRING LITERAL */
  ;
LAB_00224973:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void AdamTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    m = AllocateShadowParameters(*model);
    lm = AllocateShadowLookupParameters(*model);
    v = AllocateShadowParameters(*model);
    lv = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  static unsigned t = 0;
  for (auto p : model->parameters_list()) {
    ++t;
    auto g_t = (scale * gscale) * p->g.vec();
    auto m_t = m[pi].h.vec();
    auto v_t = v[pi].h.vec();
    auto reg = p->values.vec() * lambda;
    m_t = beta_1 * m_t + (1 - beta_1) * g_t;
    auto g2 = g_t.cwiseProduct(g_t);
    v_t = beta_2 * v_t + (1 - beta_2) * g2;
    float s1 = 1 - pow(beta_1, t);
    float s2 = 1 - pow(beta_2, t);
    auto mhat = m_t / s1;
    auto vhat = v_t / s2;
    auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vm = lm[pi].h;
    vector<Tensor>& vv = lv[pi].h;
    for (auto i : p->non_zero_grads) {
      auto m_t = vm[i].vec();
      auto v_t = vv[i].vec();
      auto g_t = scale * gscale * p->grads[i].vec();
      auto g2 = g_t.cwiseProduct(g_t);
      auto reg = p->values[i].vec() * lambda;
      m_t = beta_1 * m_t + (1 - beta_1) * g_t;
      v_t = beta_2 * v_t + (1 - beta_2) * g2;
      float s1 = 1 - pow(beta_1, t);
      float s2 = 1 - pow(beta_2, t);
      auto mhat = m_t / s1;
      auto vhat = v_t / s2;
      auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}